

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

entry_type __thiscall fasttext::Dictionary::getType(Dictionary *this,string *w)

{
  entry_type eVar1;
  long lVar2;
  
  lVar2 = std::__cxx11::string::find
                    ((char *)w,
                     (ulong)(((this->args_).
                              super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->label)._M_dataplus._M_p,0);
  if (lVar2 == 0) {
    eVar1 = label;
  }
  else {
    lVar2 = std::__cxx11::string::find
                      ((char *)w,
                       (ulong)(((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->id)._M_dataplus._M_p,0);
    eVar1 = (lVar2 == 0) * '\x02';
  }
  return eVar1;
}

Assistant:

entry_type Dictionary::getType(const std::string& w) const {
	if(w.find(args_->label) == 0)
		return entry_type::label;
	else
	{
		if(w.find(args_->id) == 0)
			return entry_type::id;
		else
			return entry_type::word;
	}
}